

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

ly_bool node_has_printable_meta(lyd_node *node)

{
  ly_bool lVar1;
  lyd_meta *local_20;
  lyd_meta *iter;
  lyd_node *node_local;
  
  if (node->meta != (lyd_meta *)0x0) {
    for (local_20 = node->meta; local_20 != (lyd_meta *)0x0; local_20 = local_20->next) {
      lVar1 = lyd_metadata_should_print(local_20);
      if (lVar1 != '\0') {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

static ly_bool
node_has_printable_meta(const struct lyd_node *node)
{
    struct lyd_meta *iter;

    if (!node->meta) {
        return 0;
    }

    LY_LIST_FOR(node->meta, iter) {
        if (lyd_metadata_should_print(iter)) {
            return 1;
        }
    }

    return 0;
}